

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O0

string * __thiscall OpenMD::Revision::getFullRevision_abi_cxx11_(Revision *this)

{
  string *in_RDI;
  string *fr;
  Revision *in_stack_ffffffffffffff98;
  string local_38 [32];
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  getVersion_abi_cxx11_(in_stack_ffffffffffffff98);
  std::__cxx11::string::assign((string *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::append((char *)in_RDI);
  getRevision_abi_cxx11_((Revision *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  return in_RDI;
}

Assistant:

std::string Revision::getFullRevision() {
    std::string fr;
    fr.assign(getVersion());
    fr.append(", ");
    fr.append(getRevision());
    return fr;
  }